

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

void __thiscall MeshLib::Solid::removeDanglingVertices(Solid *this)

{
  bool bVar1;
  HalfEdge **ppHVar2;
  Vertex *this_00;
  tVertex v_1;
  ListIterator<MeshLib::Vertex> iter;
  tVertex v;
  undefined1 local_138 [8];
  TreeIterator<MeshLib::Vertex> viter;
  List<MeshLib::Vertex> dangling_verts;
  Solid *this_local;
  
  List<MeshLib::Vertex>::List((List<MeshLib::Vertex> *)&viter.m_root);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator
            ((TreeIterator<MeshLib::Vertex> *)local_138,&this->m_verts);
  while (bVar1 = AVL::TreeIterator<MeshLib::Vertex>::end((TreeIterator<MeshLib::Vertex> *)local_138)
        , ((bVar1 ^ 0xffU) & 1) != 0) {
    iter.m_list = (List<MeshLib::Vertex> *)
                  AVL::TreeIterator<MeshLib::Vertex>::operator*
                            ((TreeIterator<MeshLib::Vertex> *)local_138);
    ppHVar2 = Vertex::halfedge((Vertex *)iter.m_list);
    if (*ppHVar2 == (HalfEdge *)0x0) {
      List<MeshLib::Vertex>::Append((List<MeshLib::Vertex> *)&viter.m_root,(Vertex *)iter.m_list);
    }
    AVL::TreeIterator<MeshLib::Vertex>::operator++((TreeIterator<MeshLib::Vertex> *)local_138);
  }
  AVL::TreeIterator<MeshLib::Vertex>::~TreeIterator((TreeIterator<MeshLib::Vertex> *)local_138);
  ListIterator<MeshLib::Vertex>::ListIterator
            ((ListIterator<MeshLib::Vertex> *)&v_1,(List<MeshLib::Vertex> *)&viter.m_root);
  while (bVar1 = ListIterator<MeshLib::Vertex>::end((ListIterator<MeshLib::Vertex> *)&v_1),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = ListIterator<MeshLib::Vertex>::operator*((ListIterator<MeshLib::Vertex> *)&v_1);
    AVL::Tree<MeshLib::Vertex>::remove(&this->m_verts,(char *)this_00);
    if (this_00 != (Vertex *)0x0) {
      Vertex::~Vertex(this_00);
      operator_delete(this_00);
    }
    ListIterator<MeshLib::Vertex>::operator++((ListIterator<MeshLib::Vertex> *)&v_1);
  }
  ListIterator<MeshLib::Vertex>::~ListIterator((ListIterator<MeshLib::Vertex> *)&v_1);
  List<MeshLib::Vertex>::~List((List<MeshLib::Vertex> *)&viter.m_root);
  return;
}

Assistant:

void 
Solid::removeDanglingVertices()
{
	List<Vertex> dangling_verts;
	//Label boundary edges
	for( AVL::TreeIterator<Vertex> viter( m_verts ); ! viter.end() ; ++ viter )
	{
		Solid::tVertex     v = *viter;
		if( v->halfedge() != NULL ) continue;
		dangling_verts.Append( v );
	}

	for( ListIterator<Vertex> iter( dangling_verts ); !iter.end(); ++ iter )
	{
		Solid::tVertex v = *iter;
		m_verts.remove( v );
		delete v;
		v = NULL;
	}
}